

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  FILE *__p;
  pointer p_Var4;
  int *piVar5;
  ostream *poVar6;
  string *psVar7;
  char *pcVar8;
  uchar *first;
  size_type __n;
  FILE *pFVar9;
  coord cVar10;
  coord cVar11;
  exception *ex;
  string local_2b0 [32];
  coord local_290;
  coord coord;
  size_t nread;
  char *ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  parser<pstore::exchange::import_ns::callbacks> parser;
  string local_1b0 [36];
  int local_18c;
  int err;
  unique_ptr<_IO_FILE,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_import_import_cpp:62:28)>
  infile;
  undefined1 local_178 [7];
  anon_class_1_0_00000001 close;
  database db;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  char **ppcStack_18;
  int exit_code;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_1c = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"pstore import utility\n",&local_41);
  pstore::command_line::parse_command_line_options(argc,argv,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pbVar3 = pstore::command_line::
           opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
           ::get((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                  *)(anonymous_namespace)::db_path_abi_cxx11_);
  bVar1 = pstore::file::exists(pbVar3);
  if (bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "error: the import database must not be an existing file.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    pbVar3 = pstore::command_line::
             opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
             ::get((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                    *)(anonymous_namespace)::db_path_abi_cxx11_);
    pstore::database::database((database *)local_178,pbVar3,writable,true);
    __p = anon_unknown.dwarf_91eb::open_input();
    std::unique_ptr<_IO_FILE,main::$_0_const>::unique_ptr<main::__0_const,void>
              ((unique_ptr<_IO_FILE,main::__0_const> *)&stack0xfffffffffffffe78,__p,
               (deleter_type *)
               ((long)&infile._M_t.
                       super___uniq_ptr_impl<_IO_FILE,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_import_import_cpp:62:28)>
                       ._M_t.
                       super__Tuple_impl<0UL,__IO_FILE_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_import_import_cpp:62:28)>
                       .super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl + 7));
    p_Var4 = std::
             unique_ptr<_IO_FILE,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/import/import.cpp:62:28)>
             ::get((unique_ptr<_IO_FILE,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_import_import_cpp:62:28)>
                    *)&stack0xfffffffffffffe78);
    if (p_Var4 == (pointer)0x0) {
      piVar5 = __errno_location();
      local_18c = *piVar5;
      poVar6 = std::operator<<((ostream *)&std::cerr,"error: could not open \"");
      (anonymous_namespace)::input_name_abi_cxx11_();
      psVar7 = pstore::utf::to_native_string(local_1b0);
      poVar6 = std::operator<<(poVar6,(string *)psVar7);
      poVar6 = std::operator<<(poVar6,"\": ");
      pcVar8 = strerror(local_18c);
      poVar6 = std::operator<<(poVar6,pcVar8);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_1b0);
      argv_local._4_4_ = 1;
      bVar1 = true;
    }
    else {
      pstore::exchange::import_ns::create_parser
                ((parser<pstore::exchange::import_ns::callbacks> *)
                 &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(database *)local_178);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr,0xffff);
      do {
        first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr);
        __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr);
        pFVar9 = (FILE *)std::
                         unique_ptr<_IO_FILE,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/import/import.cpp:62:28)>
                         ::get((unique_ptr<_IO_FILE,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_import_import_cpp:62:28)>
                                *)&stack0xfffffffffffffe78);
        cVar10 = (coord)fread(first,1,__n,pFVar9);
        coord = cVar10;
        cVar11 = (coord)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr);
        if ((ulong)cVar10 < (ulong)cVar11) {
          pFVar9 = (FILE *)std::
                           unique_ptr<_IO_FILE,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/import/import.cpp:62:28)>
                           ::get((unique_ptr<_IO_FILE,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_import_import_cpp:62:28)>
                                  *)&stack0xfffffffffffffe78);
          iVar2 = ferror(pFVar9);
          if (iVar2 != 0) {
            poVar6 = std::operator<<((ostream *)&std::cerr,"error: there was an error reading input"
                                    );
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            local_1c = 1;
            goto LAB_00110754;
          }
        }
        pstore::json::parser<pstore::exchange::import_ns::callbacks>::input<char*>
                  ((parser<pstore::exchange::import_ns::callbacks> *)
                   &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,(char *)first,
                   (char *)(first + (long)coord));
        bVar1 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                          ((parser<pstore::exchange::import_ns::callbacks> *)
                           &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar1) {
          local_290 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::coordinate
                                ((parser<pstore::exchange::import_ns::callbacks> *)
                                 &buffer.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
          (anonymous_namespace)::input_name_abi_cxx11_();
          psVar7 = pstore::utf::to_native_string(local_2b0);
          poVar6 = std::operator<<((ostream *)&std::cerr,(string *)psVar7);
          poVar6 = std::operator<<(poVar6,":");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_290.row);
          poVar6 = std::operator<<(poVar6,":");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_290.column);
          poVar6 = std::operator<<(poVar6,": error: ");
          pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                    ((parser<pstore::exchange::import_ns::callbacks> *)
                     &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::error_code::message_abi_cxx11_((error_code *)&ex);
          psVar7 = pstore::utf::to_native_string((string *)&ex);
          poVar6 = std::operator<<(poVar6,(string *)psVar7);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&ex);
          std::__cxx11::string::~string((string *)local_2b0);
          local_1c = 1;
          goto LAB_00110754;
        }
        pFVar9 = (FILE *)std::
                         unique_ptr<_IO_FILE,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/import/import.cpp:62:28)>
                         ::get((unique_ptr<_IO_FILE,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_import_import_cpp:62:28)>
                                *)&stack0xfffffffffffffe78);
        iVar2 = feof(pFVar9);
      } while (iVar2 == 0);
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof
                ((parser<pstore::exchange::import_ns::callbacks> *)
                 &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
LAB_00110754:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr);
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
                ((parser<pstore::exchange::import_ns::callbacks> *)
                 &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      bVar1 = false;
    }
    std::
    unique_ptr<_IO_FILE,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/import/import.cpp:62:28)>
    ::~unique_ptr((unique_ptr<_IO_FILE,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_import_import_cpp:62:28)>
                   *)&stack0xfffffffffffffe78);
    pstore::database::~database((database *)local_178);
    if (!bVar1) {
      argv_local._4_4_ = local_1c;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;
    PSTORE_TRY {
        parse_command_line_options (argc, argv, "pstore import utility\n");

        if (pstore::file::exists (db_path.get ())) {
            error_stream << PSTORE_NATIVE_TEXT (
                                "error: the import database must not be an existing file.")
                         << std::endl;
            return EXIT_FAILURE;
        }

        pstore::database db{db_path.get (), pstore::database::access_mode::writable};

        auto const close = [] (FILE * const file) {
            if (file != stdin) {
                std::fclose (file);
            }
        };
        std::unique_ptr<FILE, decltype (close)> infile{open_input (), close};
        if (infile.get () == nullptr) {
            auto const err = errno;
            error_stream << PSTORE_NATIVE_TEXT (R"(error: could not open ")")
                         << pstore::utf::to_native_string (input_name ()) << R"(": )"
                         << std::strerror (err) << std::endl;
            return EXIT_FAILURE;
        }

        auto parser = pstore::exchange::import_ns::create_parser (db);

        std::vector<std::uint8_t> buffer;
        buffer.resize (65535);

        for (;;) {
            auto * const ptr = reinterpret_cast<char *> (buffer.data ());
            std::size_t const nread =
                std::fread (ptr, sizeof (std::uint8_t), buffer.size (), infile.get ());
            if (nread < buffer.size ()) {
                if (std::ferror (infile.get ())) {
                    error_stream << PSTORE_NATIVE_TEXT ("error: there was an error reading input")
                                 << std::endl;
                    exit_code = EXIT_FAILURE;
                    break;
                }
            }

            parser.input (ptr, ptr + nread);
            if (parser.has_error ()) {
                auto const coord = parser.coordinate ();
                error_stream << pstore::utf::to_native_string (input_name ())
                             << PSTORE_NATIVE_TEXT (":") << coord.row << PSTORE_NATIVE_TEXT (":")
                             << coord.column << PSTORE_NATIVE_TEXT (": error: ")
                             << pstore::utf::to_native_string (parser.last_error ().message ())
                             << std::endl;
                exit_code = EXIT_FAILURE;
                break;
            }

            // Stop if we've reached the end of the file.
            if (std::feof (infile.get ())) {
                parser.eof ();
                break;
            }
        }
    }